

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

string * __thiscall
cmGeneratorTarget::GetImportedXcFrameworkPath
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  TargetType TVar4;
  cmValue cVar5;
  size_type *psVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string suffix;
  cmValue loc;
  string desiredConfig;
  string impProp;
  cmValue imp;
  string local_f0;
  string local_d0;
  cmValue local_b0;
  string local_a8;
  string local_88;
  string local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  undefined8 local_40;
  cmValue local_38;
  
  bVar3 = cmTarget::IsApple(this->Target);
  if (((!bVar3) || (bVar3 = cmTarget::IsImported(this->Target), !bVar3)) ||
     ((TVar4 = cmTarget::GetType(this->Target), TVar4 != SHARED_LIBRARY &&
      ((TVar4 = cmTarget::GetType(this->Target), TVar4 != STATIC_LIBRARY &&
       (TVar4 = cmTarget::GetType(this->Target), TVar4 != UNKNOWN_LIBRARY)))))) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  pcVar2 = (config->_M_dataplus)._M_p;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar2,pcVar2 + config->_M_string_length);
  if (config->_M_string_length == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_a8,0,(char *)local_a8._M_string_length,0x89d6af);
  }
  paVar1 = &local_f0.field_2;
  local_f0._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_b0.Value = (string *)0x0;
  local_38.Value = (string *)0x0;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  bVar3 = cmTarget::GetMappedConfig(this->Target,&local_a8,&local_b0,&local_38,&local_d0);
  if (bVar3) {
    if (local_b0.Value == (string *)0x0) {
      local_68._M_dataplus._M_p = &DAT_00000011;
      local_68._M_string_length = 0x897219;
      local_68.field_2._M_allocated_capacity = 0;
      local_68.field_2._8_8_ = local_d0._M_string_length;
      local_48 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_d0._M_dataplus._M_p;
      local_40 = 0;
      views._M_len = 2;
      views._M_array = (iterator)&local_68;
      cmCatViews(&local_88,views);
      cVar5 = GetProperty(this,&local_88);
      if (cVar5.Value == (string *)0x0) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"IMPORTED_LOCATION","");
        cVar5 = GetProperty(this,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if (cVar5.Value != (string *)0x0) {
          std::__cxx11::string::_M_assign((string *)&local_f0);
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_f0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_f0);
    }
    bVar3 = cmSystemTools::IsPathToXcFramework(&local_f0);
    if (bVar3) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p == paVar1) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,local_f0.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_f0.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_f0._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,local_f0.field_2._M_local_buf[0])
        ;
      }
      psVar6 = &local_f0._M_string_length;
      __return_storage_ptr__->_M_string_length = local_f0._M_string_length;
      paVar7 = paVar1;
      local_f0._M_dataplus._M_p = (pointer)paVar1;
      goto LAB_00597626;
    }
  }
  paVar7 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar7;
  psVar6 = &__return_storage_ptr__->_M_string_length;
LAB_00597626:
  *psVar6 = 0;
  paVar7->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p,
                    CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                             local_f0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
    return __return_storage_ptr__;
  }
  operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetImportedXcFrameworkPath(
  const std::string& config) const
{
  if (!(this->IsApple() && this->IsImported() &&
        (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
         this->GetType() == cmStateEnums::STATIC_LIBRARY ||
         this->GetType() == cmStateEnums::UNKNOWN_LIBRARY))) {
    return {};
  }

  std::string desiredConfig = config;
  if (config.empty()) {
    desiredConfig = "NOCONFIG";
  }

  std::string result;

  cmValue loc = nullptr;
  cmValue imp = nullptr;
  std::string suffix;

  if (this->Target->GetMappedConfig(desiredConfig, loc, imp, suffix)) {
    if (loc) {
      result = *loc;
    } else {
      std::string impProp = cmStrCat("IMPORTED_LOCATION", suffix);
      if (cmValue configLocation = this->GetProperty(impProp)) {
        result = *configLocation;
      } else if (cmValue location = this->GetProperty("IMPORTED_LOCATION")) {
        result = *location;
      }
    }

    if (cmSystemTools::IsPathToXcFramework(result)) {
      return result;
    }
  }

  return {};
}